

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::BitState<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::BitAndOperation>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  unsigned_long *puVar1;
  data_ptr_t pdVar2;
  ulong uVar3;
  sel_t *psVar4;
  int64_t iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  data_ptr_t pdVar11;
  UnifiedVectorFormat idata;
  hugeint_t local_90;
  Vector *local_80;
  UnifiedVectorFormat local_78;
  
  if (input->vector_type == FLAT_VECTOR) {
    pdVar2 = input->data;
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      uVar6 = 0;
      uVar8 = 0;
      local_80 = input;
      do {
        puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar1 == (unsigned_long *)0x0) {
          uVar9 = uVar8 + 0x40;
          if (count <= uVar8 + 0x40) {
            uVar9 = count;
          }
LAB_00dc2006:
          uVar10 = uVar8;
          if (uVar8 < uVar9) {
            pdVar11 = pdVar2 + uVar8 * 0x10 + 8;
            do {
              local_78.sel = *(SelectionVector **)(pdVar11 + -8);
              local_78.data = *(data_ptr_t *)pdVar11;
              if (*state == '\0') {
                *(SelectionVector **)(state + 8) = local_78.sel;
                *(data_ptr_t *)(state + 0x10) = local_78.data;
                *state = '\x01';
              }
              else {
                hugeint_t::operator&=((hugeint_t *)(state + 8),(hugeint_t *)&local_78);
              }
              uVar8 = uVar8 + 1;
              pdVar11 = pdVar11 + 0x10;
              uVar10 = uVar9;
            } while (uVar9 != uVar8);
          }
        }
        else {
          uVar3 = puVar1[uVar6];
          uVar9 = uVar8 + 0x40;
          if (count <= uVar8 + 0x40) {
            uVar9 = count;
          }
          if (uVar3 == 0xffffffffffffffff) goto LAB_00dc2006;
          uVar10 = uVar9;
          if ((uVar3 != 0) && (uVar10 = uVar8, uVar8 < uVar9)) {
            pdVar11 = pdVar2 + uVar8 * 0x10 + 8;
            uVar7 = 0;
            do {
              if ((uVar3 >> (uVar7 & 0x3f) & 1) != 0) {
                local_78.sel = *(SelectionVector **)(pdVar11 + -8);
                local_78.data = *(data_ptr_t *)pdVar11;
                if (*state == '\0') {
                  *(SelectionVector **)(state + 8) = local_78.sel;
                  *(data_ptr_t *)(state + 0x10) = local_78.data;
                  *state = '\x01';
                }
                else {
                  hugeint_t::operator&=((hugeint_t *)(state + 8),(hugeint_t *)&local_78);
                }
              }
              uVar7 = uVar7 + 1;
              pdVar11 = pdVar11 + 0x10;
              input = local_80;
              uVar10 = uVar9;
            } while (uVar9 - uVar8 != uVar7);
          }
        }
        uVar6 = uVar6 + 1;
        uVar8 = uVar10;
      } while (uVar6 != count + 0x3f >> 6);
    }
  }
  else if (input->vector_type == CONSTANT_VECTOR) {
    puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) {
      local_78.sel = *(SelectionVector **)input->data;
      local_78.data = *(data_ptr_t *)(input->data + 8);
      if (*state == '\0') {
        *(SelectionVector **)(state + 8) = local_78.sel;
        *(data_ptr_t *)(state + 0x10) = local_78.data;
        *state = '\x01';
      }
      else {
        hugeint_t::operator&=((hugeint_t *)(state + 8),(hugeint_t *)&local_78);
      }
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(input,count,&local_78);
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar4 = (local_78.sel)->sel_vector;
        uVar8 = 0;
        do {
          uVar6 = uVar8;
          if (psVar4 != (sel_t *)0x0) {
            uVar6 = (ulong)psVar4[uVar8];
          }
          iVar5 = *(int64_t *)(local_78.data + uVar6 * 0x10 + 8);
          if (*state == '\0') {
            *(uint64_t *)(state + 8) = *(uint64_t *)(local_78.data + uVar6 * 0x10);
            *(int64_t *)(state + 0x10) = iVar5;
            *state = '\x01';
          }
          else {
            local_90.lower = *(uint64_t *)(local_78.data + uVar6 * 0x10);
            local_90.upper = iVar5;
            hugeint_t::operator&=((hugeint_t *)(state + 8),&local_90);
          }
          uVar8 = uVar8 + 1;
        } while (count != uVar8);
      }
    }
    else if (count != 0) {
      psVar4 = (local_78.sel)->sel_vector;
      uVar8 = 0;
      do {
        uVar6 = uVar8;
        if (psVar4 != (sel_t *)0x0) {
          uVar6 = (ulong)psVar4[uVar8];
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar6 >> 6]
             >> (uVar6 & 0x3f) & 1) != 0)) {
          iVar5 = *(int64_t *)(local_78.data + uVar6 * 0x10 + 8);
          if (*state == '\0') {
            *(uint64_t *)(state + 8) = *(uint64_t *)(local_78.data + uVar6 * 0x10);
            *(int64_t *)(state + 0x10) = iVar5;
            *state = '\x01';
          }
          else {
            local_90.lower = *(uint64_t *)(local_78.data + uVar6 * 0x10);
            local_90.upper = iVar5;
            hugeint_t::operator&=((hugeint_t *)(state + 8),&local_90);
          }
        }
        uVar8 = uVar8 + 1;
      } while (count != uVar8);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}